

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.cpp
# Opt level: O0

GdlRuleItem * __thiscall
GdlRule::RhsItemAt(GdlRule *this,GrpLineAndFile *lnf,int irit,string *staInput,string *staAlias,
                  bool fSubItem)

{
  ulong uVar1;
  bool bVar2;
  Symbol pGVar3;
  size_type_conflict sVar4;
  reference ppGVar5;
  value_type pGVar6;
  void *pvVar7;
  value_type *__x;
  vector<GdlAlias_*,_std::allocator<GdlAlias_*>_> *this_00;
  string *in_RCX;
  int in_EDX;
  long in_RDI;
  string *in_R8;
  byte in_R9B;
  GdlRuleItem *pritNew;
  GdlSubstitutionItem *pritsub;
  GdlSetAttrItem *pritset;
  size_t iritT;
  Symbol psymClassOrPlaceHolder;
  int critRhs;
  bool fContext;
  GdlSetAttrItem *in_stack_fffffffffffffc88;
  GdlSubstitutionItem *in_stack_fffffffffffffc90;
  Symbol in_stack_fffffffffffffc98;
  GdlSubstitutionItem *in_stack_fffffffffffffca0;
  GrcSymbolTable *in_stack_fffffffffffffcc8;
  GrcSymbolTable *in_stack_fffffffffffffcd0;
  Symbol in_stack_fffffffffffffcd8;
  allocator *in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  allocator *paVar8;
  int nID;
  GrcErrorList *in_stack_fffffffffffffcf0;
  long *local_2b0;
  string local_260 [32];
  vector<GdlAlias_*,_std::allocator<GdlAlias_*>_> *local_240;
  undefined1 local_232;
  allocator local_231;
  string local_230 [32];
  Symbol local_210;
  allocator local_201;
  string local_200 [32];
  undefined1 local_1e0 [71];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [39];
  undefined1 local_149;
  string local_148 [32];
  void *local_128;
  undefined1 local_119;
  string local_118 [32];
  void *local_f8;
  value_type local_f0;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  long *local_80;
  ulong local_78;
  string local_60 [32];
  Symbol local_40;
  int local_38;
  byte local_32;
  byte local_31;
  int local_1c;
  Symbol local_8;
  
  local_31 = in_R9B & 1;
  local_32 = 0;
  local_38 = 0;
  local_1c = in_EDX;
  GrcManager::SymbolTable(&g_cman);
  std::__cxx11::string::string(local_60,in_RCX);
  pGVar3 = GrcSymbolTable::FindSymbol(in_stack_fffffffffffffcd0,(string *)in_stack_fffffffffffffcc8)
  ;
  std::__cxx11::string::~string(local_60);
  local_78 = 0;
  local_40 = pGVar3;
  do {
    uVar1 = local_78;
    sVar4 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::size
                      ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)(in_RDI + 0x30));
    nID = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
    if (sVar4 <= uVar1) {
LAB_001a3d16:
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
      if (bVar2) {
        paVar8 = &local_171;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_170,"Line break indicator # cannot appear in the right-hand-side",paVar8);
        GrcErrorList::AddError
                  (in_stack_fffffffffffffcf0,(int)((ulong)paVar8 >> 0x20),
                   (GdlObject *)in_stack_fffffffffffffce0,&in_stack_fffffffffffffcd8->m_staFieldName
                  );
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        local_8 = (Symbol)0x0;
      }
      else {
        if ((local_40 == (Symbol)0x0) ||
           (((bVar2 = GrcSymbolTableEntry::FitsSymbolType
                                (in_stack_fffffffffffffc98,
                                 (SymbolType)((ulong)in_stack_fffffffffffffc90 >> 0x20)), !bVar2 &&
             (bVar2 = GrcSymbolTableEntry::FitsSymbolType
                                (in_stack_fffffffffffffc98,
                                 (SymbolType)((ulong)in_stack_fffffffffffffc90 >> 0x20)), !bVar2))
            && (bVar2 = GrcSymbolTableEntry::FitsSymbolType
                                  (in_stack_fffffffffffffc98,
                                   (SymbolType)((ulong)in_stack_fffffffffffffc90 >> 0x20)), !bVar2))
           )) {
          in_stack_fffffffffffffce0 = &local_199;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_198,"Undefined class name: ",in_stack_fffffffffffffce0)
          ;
          std::__cxx11::string::string((string *)(local_1e0 + 0x20),in_RCX);
          GrcErrorList::AddError
                    (in_stack_fffffffffffffcf0,nID,(GdlObject *)in_stack_fffffffffffffce0,
                     &in_stack_fffffffffffffcd8->m_staFieldName,(string *)in_stack_fffffffffffffcd0,
                     (GrpLineAndFile *)in_stack_fffffffffffffcc8);
          std::__cxx11::string::~string((string *)(local_1e0 + 0x20));
          std::__cxx11::string::~string(local_198);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
          in_stack_fffffffffffffcc8 = GrcManager::SymbolTable(&g_cman);
          in_stack_fffffffffffffcd0 = (GrcSymbolTable *)local_1e0;
          GdlGlyphClassDefn::Undefined_abi_cxx11_();
          in_stack_fffffffffffffcd8 =
               GrcSymbolTable::FindSymbol
                         (in_stack_fffffffffffffcd0,(string *)in_stack_fffffffffffffcc8);
          local_40 = in_stack_fffffffffffffcd8;
          std::__cxx11::string::~string((string *)local_1e0);
        }
        if ((local_32 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_200,"Context does not account for all items in the right-hand-side",
                     &local_201);
          GrcErrorList::AddError
                    (in_stack_fffffffffffffcf0,nID,(GdlObject *)in_stack_fffffffffffffce0,
                     &in_stack_fffffffffffffcd8->m_staFieldName);
          std::__cxx11::string::~string(local_200);
          std::allocator<char>::~allocator((allocator<char> *)&local_201);
        }
        if ((local_31 & 1) == 0) {
          in_stack_fffffffffffffc98 = (Symbol)operator_new(0x98);
          GdlSetAttrItem::GdlSetAttrItem
                    (&in_stack_fffffffffffffc90->super_GdlSetAttrItem,
                     (Symbol)in_stack_fffffffffffffc88);
          local_210 = in_stack_fffffffffffffc98;
        }
        else {
          pGVar3 = (Symbol)operator_new(0xf0);
          local_232 = 1;
          GrcManager::SymbolTable(&g_cman);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_230,"_",&local_231);
          in_stack_fffffffffffffca0 =
               (GdlSubstitutionItem *)
               GrcSymbolTable::FindSymbol
                         (in_stack_fffffffffffffcd0,(string *)in_stack_fffffffffffffcc8);
          GdlSubstitutionItem::GdlSubstitutionItem
                    (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                     (Symbol)in_stack_fffffffffffffc90);
          local_232 = 0;
          local_210 = pGVar3;
          std::__cxx11::string::~string(local_230);
          std::allocator<char>::~allocator((allocator<char> *)&local_231);
        }
        GdlObject::SetLineAndFile
                  ((GdlObject *)in_stack_fffffffffffffc90,
                   (GrpLineAndFile *)in_stack_fffffffffffffc88);
        sVar4 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::size
                          ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)(in_RDI + 0x30))
        ;
        *(int *)&local_210->m_fHasData = (int)sVar4;
        *(int *)&local_210->m_pData = *(int *)&local_210->m_fHasData;
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
        if (bVar2) {
          __x = (value_type *)(in_RDI + 0x60);
          this_00 = (vector<GdlAlias_*,_std::allocator<GdlAlias_*>_> *)operator_new(0x28);
          std::__cxx11::string::string(local_260,in_R8);
          GdlAlias::GdlAlias((GdlAlias *)in_stack_fffffffffffffca0,
                             &in_stack_fffffffffffffc98->m_staFieldName,
                             (int)((ulong)this_00 >> 0x20));
          local_240 = this_00;
          std::vector<GdlAlias_*,_std::allocator<GdlAlias_*>_>::push_back(this_00,__x);
          std::__cxx11::string::~string(local_260);
        }
        std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::push_back
                  ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                   in_stack_fffffffffffffca0,(value_type *)in_stack_fffffffffffffc98);
        local_8 = local_210;
      }
      return (GdlRuleItem *)local_8;
    }
    ppGVar5 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                        ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)(in_RDI + 0x30),
                         local_78);
    if (*ppGVar5 == (value_type)0x0) {
      local_2b0 = (long *)0x0;
    }
    else {
      local_2b0 = (long *)__dynamic_cast(*ppGVar5,&GdlRuleItem::typeinfo,&GdlSetAttrItem::typeinfo,0
                                        );
    }
    nID = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
    local_80 = local_2b0;
    if (local_2b0 == (long *)0x0) {
      local_32 = 1;
    }
    else {
      if (local_1c == local_38) {
        if ((local_40 == (Symbol)0x0) ||
           ((((bVar2 = GrcSymbolTableEntry::FitsSymbolType
                                 (in_stack_fffffffffffffc98,
                                  (SymbolType)((ulong)in_stack_fffffffffffffc90 >> 0x20)), !bVar2 &&
              (bVar2 = GrcSymbolTableEntry::FitsSymbolType
                                 (in_stack_fffffffffffffc98,
                                  (SymbolType)((ulong)in_stack_fffffffffffffc90 >> 0x20)), !bVar2))
             && (bVar2 = GrcSymbolTableEntry::FitsSymbolType
                                   (in_stack_fffffffffffffc98,
                                    (SymbolType)((ulong)in_stack_fffffffffffffc90 >> 0x20)), !bVar2)
             ) && (bVar2 = GrcSymbolTableEntry::FitsSymbolType
                                     (in_stack_fffffffffffffc98,
                                      (SymbolType)((ulong)in_stack_fffffffffffffc90 >> 0x20)),
                  !bVar2)))) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a0,"Undefined class name: ",&local_a1);
          std::__cxx11::string::string(local_c8,in_RCX);
          GrcErrorList::AddError
                    (in_stack_fffffffffffffcf0,nID,(GdlObject *)in_stack_fffffffffffffce0,
                     &in_stack_fffffffffffffcd8->m_staFieldName,(string *)in_stack_fffffffffffffcd0,
                     (GrpLineAndFile *)in_stack_fffffffffffffcc8);
          std::__cxx11::string::~string(local_c8);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
          GrcManager::SymbolTable(&g_cman);
          GdlGlyphClassDefn::Undefined_abi_cxx11_();
          local_40 = GrcSymbolTable::FindSymbol
                               (in_stack_fffffffffffffcd0,(string *)in_stack_fffffffffffffcc8);
          std::__cxx11::string::~string(local_e8);
        }
        bVar2 = GrcSymbolTableEntry::FitsSymbolType
                          (in_stack_fffffffffffffc98,
                           (SymbolType)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        if (!bVar2) {
          if ((local_31 & 1) != 0) {
            pGVar6 = (value_type)operator_new(0xf0);
            GdlSubstitutionItem::GdlSubstitutionItem
                      (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            local_f0 = pGVar6;
            GdlObject::SetLineAndFile
                      ((GdlObject *)in_stack_fffffffffffffc90,
                       (GrpLineAndFile *)in_stack_fffffffffffffc88);
            *(Symbol *)&local_f0[1].super_GdlObject.m_lnf.field_0x18 = local_40;
            local_f0->m_psymInput = (Symbol)0x0;
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
            if (bVar2) {
              pvVar7 = operator_new(0x28);
              local_119 = 1;
              std::__cxx11::string::string(local_118,in_R8);
              std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                        ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)(in_RDI + 0x30),
                         local_78);
              GdlAlias::GdlAlias((GdlAlias *)in_stack_fffffffffffffca0,
                                 &in_stack_fffffffffffffc98->m_staFieldName,
                                 (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
              local_119 = 0;
              local_f8 = pvVar7;
              std::vector<GdlAlias_*,_std::allocator<GdlAlias_*>_>::push_back
                        ((vector<GdlAlias_*,_std::allocator<GdlAlias_*>_> *)
                         in_stack_fffffffffffffc90,(value_type *)in_stack_fffffffffffffc88);
              std::__cxx11::string::~string(local_118);
            }
            if (local_80 != (long *)0x0) {
              (**(code **)(*local_80 + 0x10))();
            }
            pGVar6 = local_f0;
            ppGVar5 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                                ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                                 (in_RDI + 0x30),local_78);
            *ppGVar5 = pGVar6;
            return local_f0;
          }
          std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                    ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)(in_RDI + 0x30),
                     local_78);
          GdlObject::SetLineAndFile
                    ((GdlObject *)in_stack_fffffffffffffc90,
                     (GrpLineAndFile *)in_stack_fffffffffffffc88);
          pGVar3 = local_40;
          ppGVar5 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                              ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                               (in_RDI + 0x30),local_78);
          (*ppGVar5)->m_psymInput = pGVar3;
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
          if (bVar2) {
            pvVar7 = operator_new(0x28);
            local_149 = 1;
            std::__cxx11::string::string(local_148,in_R8);
            std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                      ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)(in_RDI + 0x30),
                       local_78);
            GdlAlias::GdlAlias((GdlAlias *)in_stack_fffffffffffffca0,
                               &in_stack_fffffffffffffc98->m_staFieldName,
                               (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
            local_149 = 0;
            local_128 = pvVar7;
            std::vector<GdlAlias_*,_std::allocator<GdlAlias_*>_>::push_back
                      ((vector<GdlAlias_*,_std::allocator<GdlAlias_*>_> *)in_stack_fffffffffffffc90,
                       (value_type *)in_stack_fffffffffffffc88);
            std::__cxx11::string::~string(local_148);
          }
          ppGVar5 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                              ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)
                               (in_RDI + 0x30),local_78);
          return *ppGVar5;
        }
        goto LAB_001a3d16;
      }
      local_38 = local_38 + 1;
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

GdlRuleItem * GdlRule::RhsItemAt(GrpLineAndFile & lnf, int irit,
	std::string staInput, std::string staAlias, bool fSubItem)
{
	bool fContext = false;
	int critRhs = 0;

	Symbol psymClassOrPlaceHolder = g_cman.SymbolTable()->FindSymbol(staInput);

	for (size_t iritT = 0; iritT < m_vprit.size(); iritT++)
	{
		GdlSetAttrItem * pritset = dynamic_cast<GdlSetAttrItem*>(m_vprit[iritT]);
		if (!pritset)
			fContext = true;
		else
		{
			if (irit == critRhs)
			{
				if (!psymClassOrPlaceHolder || 
					(!psymClassOrPlaceHolder->FitsSymbolType(ksymtClass) &&
						!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialUnderscore) &&
						!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialLb) &&
						!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialAt)))
				{
					g_errorList.AddError(3137, this,
						"Undefined class name: ",
						staInput,
						lnf);
					psymClassOrPlaceHolder =
						g_cman.SymbolTable()->FindSymbol(GdlGlyphClassDefn::Undefined());
				}

				if (psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialLb))
				{
					goto LLbError;
				}
				else if (fSubItem)
				{
					GdlSubstitutionItem * pritsub = new GdlSubstitutionItem(*pritset);
					pritsub->SetLineAndFile(lnf);
					pritsub->m_psymOutput = psymClassOrPlaceHolder;
					pritsub->m_psymInput = NULL;	// must be set by LHS

					//	record the 1-based slot-alias value, if any
					if (staAlias != "")
						m_vpalias.push_back(
							new GdlAlias(staAlias, m_vprit[iritT]->m_iritContextPos + 1));

					delete pritset;
					m_vprit[iritT] = pritsub;
					return pritsub;
				}

				else
				{
					m_vprit[iritT]->SetLineAndFile(lnf);
					m_vprit[iritT]->m_psymInput = psymClassOrPlaceHolder;

					//	record the 1-based slot-alias value, if any
					if (staAlias != "")
						m_vpalias.push_back(
							new GdlAlias(staAlias, m_vprit[iritT]->m_iritContextPos + 1));

					return m_vprit[iritT];
				}
			}

			else
				critRhs++;
		}
	}

	//	Need to add an item

LLbError:
	if (staInput == "#")
	{
		g_errorList.AddError(3138, this,
			"Line break indicator # cannot appear in the right-hand-side");
		return NULL;
	}

	if (!psymClassOrPlaceHolder ||
		(!psymClassOrPlaceHolder->FitsSymbolType(ksymtClass) &&
			!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialUnderscore) &&
			!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialAt)))
	{
		g_errorList.AddError(3139, this,
			"Undefined class name: ",
			staInput,
			lnf);
		psymClassOrPlaceHolder = g_cman.SymbolTable()->FindSymbol(GdlGlyphClassDefn::Undefined());
	}

	//	Record an error if there was a context for this rule--then pretend that
	//	there was an extra _ on the end of the context.
	if (fContext)
	{
		g_errorList.AddError(3140, this,
			"Context does not account for all items in the right-hand-side");
	}

	GdlRuleItem * pritNew;
	if (fSubItem)
		pritNew = new GdlSubstitutionItem(
			g_cman.SymbolTable()->FindSymbol("_"),
			psymClassOrPlaceHolder);
	else
		pritNew = new GdlSetAttrItem(psymClassOrPlaceHolder);

	pritNew->SetLineAndFile(lnf);
	pritNew->m_iritContextPos = int(m_vprit.size());
	pritNew->m_iritContextPosOrig = pritNew->m_iritContextPos;

	//	record the 1-based slot-alias value, if any
	if (staAlias != "")
		m_vpalias.push_back(new GdlAlias(staAlias, pritNew->m_iritContextPos + 1));

	m_vprit.push_back(pritNew);
	return pritNew;
}